

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O2

Expression * __thiscall wasm::AlignmentLowering::lowerStoreI32(AlignmentLowering *this,Store *curr)

{
  ExpressionList *pEVar1;
  Name *pNVar2;
  ulong uVar3;
  address64_t aVar4;
  Name memory;
  Block *pBVar5;
  Index IVar6;
  Index index;
  Memory *pMVar7;
  LocalGet *pLVar8;
  LocalGet *pLVar9;
  Store *pSVar10;
  Const *pCVar11;
  Binary *pBVar12;
  uint bytes;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Address offset;
  size_t sVar13;
  char *pcVar14;
  initializer_list<wasm::Expression_*> local_88;
  LocalSet *local_78;
  LocalSet *local_70;
  Block *local_68;
  string_view *local_60;
  Address local_58;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_50;
  uintptr_t local_48;
  Index local_40;
  Index local_3c;
  Builder local_38;
  Builder builder;
  
  uVar3 = (curr->align).addr;
  if (uVar3 == 0) {
    return (Expression *)curr;
  }
  if (uVar3 == curr->bytes) {
    return (Expression *)curr;
  }
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
       ).super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       currModule;
  if ((curr->value->type).id != 2) {
    __assert_fail("curr->value->type == Type::i32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                  ,0x92,"Expression *wasm::AlignmentLowering::lowerStoreI32(Store *)");
  }
  pNVar2 = &curr->memory;
  pMVar7 = Module::getMemory(local_38.wasm,(Name)(curr->memory).super_IString.str);
  local_48 = (pMVar7->indexType).id;
  IVar6 = Builder::addVar((this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .currFunction,(Type)local_48);
  index = Builder::addVar((this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .currFunction,(Type)0x2);
  local_3c = IVar6;
  local_78 = Builder::makeLocalSet(&local_38,IVar6,curr->ptr);
  local_40 = index;
  local_70 = Builder::makeLocalSet(&local_38,index,curr->value);
  local_88._M_len = 2;
  local_88._M_array = (iterator)&local_78;
  local_68 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (&local_38,&local_88);
  local_60 = (string_view *)pNVar2;
  if (curr->bytes == '\x04') {
    aVar4 = (curr->align).addr;
    if (aVar4 != 2) {
      if (aVar4 != 1) {
        handle_unreachable("invalid alignment",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0xe9);
      }
      pEVar1 = &local_68->list;
      local_58.addr = (curr->offset).addr;
      local_50 = &pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      ;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      pLVar8->index = local_3c;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           local_48;
      pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      pLVar9->index = local_40;
      (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      pSVar10 = Builder::makeStore(&local_38,1,local_58,1,(Expression *)pLVar8,(Expression *)pLVar9,
                                   (Type)0x2,(Name)(pNVar2->super_IString).str);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,(Expression *)pSVar10);
      aVar4 = (curr->offset).addr;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      pLVar8->index = local_3c;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           local_48;
      pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      pLVar9->index = local_40;
      (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      pCVar11 = Builder::makeConst<int>(&local_38,8);
      pBVar12 = Builder::makeBinary(&local_38,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
      pSVar10 = Builder::makeStore(&local_38,1,(Address)(aVar4 + 1),1,(Expression *)pLVar8,
                                   (Expression *)pBVar12,(Type)0x2,(Name)*local_60);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_50,(Expression *)pSVar10);
      aVar4 = (curr->offset).addr;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      pLVar8->index = local_3c;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           local_48;
      pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      pLVar9->index = local_40;
      (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      pCVar11 = Builder::makeConst<int>(&local_38,0x10);
      pBVar12 = Builder::makeBinary(&local_38,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
      pSVar10 = Builder::makeStore(&local_38,1,(Address)(aVar4 + 2),1,(Expression *)pLVar8,
                                   (Expression *)pBVar12,(Type)0x2,(Name)*local_60);
      this_00 = local_50;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_50,(Expression *)pSVar10);
      aVar4 = (curr->offset).addr;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      pLVar8->index = local_3c;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           local_48;
      pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      pLVar9->index = local_40;
      (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      pCVar11 = Builder::makeConst<int>(&local_38,0x18);
      pBVar12 = Builder::makeBinary(&local_38,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
      pSVar10 = Builder::makeStore(&local_38,1,(Address)(aVar4 + 3),1,(Expression *)pLVar8,
                                   (Expression *)pBVar12,(Type)0x2,(Name)*local_60);
      goto LAB_007bfcd1;
    }
    pEVar1 = &local_68->list;
    local_58.addr = (curr->offset).addr;
    local_50 = &pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar8->index = local_3c;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_48;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar9->index = local_40;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    pSVar10 = Builder::makeStore(&local_38,2,local_58,2,(Expression *)pLVar8,(Expression *)pLVar9,
                                 (Type)0x2,(Name)(pNVar2->super_IString).str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pSVar10);
    offset.addr = (curr->offset).addr + 2;
    pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar8->index = local_3c;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_48;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar9->index = local_40;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    pCVar11 = Builder::makeConst<int>(&local_38,0x10);
    pBVar12 = Builder::makeBinary(&local_38,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
    sVar13 = ((string_view *)&local_60->_M_len)->_M_len;
    pcVar14 = local_60->_M_str;
    bytes = 2;
  }
  else {
    if (curr->bytes != '\x02') {
      handle_unreachable("invalid size",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                         ,0xec);
    }
    local_50 = &(local_68->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    local_58.addr = (curr->offset).addr;
    pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar8->index = local_3c;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_48;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    IVar6 = local_40;
    pLVar9->index = local_40;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    pSVar10 = Builder::makeStore(&local_38,1,local_58,1,(Expression *)pLVar8,(Expression *)pLVar9,
                                 (Type)0x2,(Name)(pNVar2->super_IString).str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_50,(Expression *)pSVar10);
    offset.addr = (curr->offset).addr + 1;
    pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar8->index = local_3c;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_48;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar9->index = IVar6;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    pCVar11 = Builder::makeConst<int>(&local_38,8);
    pBVar12 = Builder::makeBinary(&local_38,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
    sVar13 = ((string_view *)&local_60->_M_len)->_M_len;
    pcVar14 = local_60->_M_str;
    bytes = 1;
  }
  memory.super_IString.str._M_str = pcVar14;
  memory.super_IString.str._M_len = sVar13;
  pSVar10 = Builder::makeStore(&local_38,bytes,offset,bytes,(Expression *)pLVar8,
                               (Expression *)pBVar12,(Type)0x2,memory);
  this_00 = local_50;
LAB_007bfcd1:
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (this_00,(Expression *)pSVar10);
  pBVar5 = local_68;
  Block::finalize(local_68);
  return (Expression *)pBVar5;
}

Assistant:

Expression* lowerStoreI32(Store* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    Builder builder(*getModule());
    assert(curr->value->type == Type::i32);
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    auto tempPtr = builder.addVar(getFunction(), indexType);
    auto tempValue = builder.addVar(getFunction(), Type::i32);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(tempPtr, curr->ptr),
                         builder.makeLocalSet(tempValue, curr->value)});
    if (curr->bytes == 2) {
      block->list.push_back(
        builder.makeStore(1,
                          curr->offset,
                          1,
                          builder.makeLocalGet(tempPtr, indexType),
                          builder.makeLocalGet(tempValue, Type::i32),
                          Type::i32,
                          curr->memory));
      block->list.push_back(builder.makeStore(
        1,
        curr->offset + 1,
        1,
        builder.makeLocalGet(tempPtr, indexType),
        builder.makeBinary(ShrUInt32,
                           builder.makeLocalGet(tempValue, Type::i32),
                           builder.makeConst(int32_t(8))),
        Type::i32,
        curr->memory));
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        block->list.push_back(
          builder.makeStore(1,
                            curr->offset,
                            1,
                            builder.makeLocalGet(tempPtr, indexType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 1,
          1,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(8))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 2,
          1,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 3,
          1,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(24))),
          Type::i32,
          curr->memory));
      } else if (curr->align == 2) {
        block->list.push_back(
          builder.makeStore(2,
                            curr->offset,
                            2,
                            builder.makeLocalGet(tempPtr, indexType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          2,
          curr->offset + 2,
          2,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    block->finalize();
    return block;
  }